

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int luaK_exp2K(FuncState *fs,expdesc *e)

{
  int iVar1;
  TValue *v;
  int iVar2;
  TValue k;
  TValue local_20;
  
  if (e->t != e->f) {
    return 0;
  }
  iVar2 = 0;
  switch(e->k) {
  case VNIL:
    v = &local_20;
    local_20.tt_ = '\0';
    k.value_ = (Value)fs->kcache;
    k.tt_ = 'E';
    goto LAB_00121ded;
  case VTRUE:
    k.tt_ = '\x11';
    goto LAB_00121dea;
  case VFALSE:
    k.tt_ = '\x01';
LAB_00121dea:
    v = &k;
LAB_00121ded:
    iVar1 = k2proto(fs,&k,v);
    break;
  case VK:
    iVar1 = (e->u).info;
    break;
  case VKFLT:
    iVar1 = luaK_numberK(fs,(e->u).nval);
    break;
  case VKINT:
    iVar1 = luaK_intK(fs,(e->u).ival);
    break;
  case VKSTR:
    iVar1 = stringK(fs,(e->u).strval);
    break;
  default:
    goto switchD_00121da6_default;
  }
  iVar2 = 0;
  if (iVar1 < 0x100) {
    e->k = VK;
    (e->u).info = iVar1;
    iVar2 = 1;
  }
switchD_00121da6_default:
  return iVar2;
}

Assistant:

static int luaK_exp2K (FuncState *fs, expdesc *e) {
  if (!hasjumps(e)) {
    int info;
    switch (e->k) {  /* move constants to 'k' */
      case VTRUE: info = boolT(fs); break;
      case VFALSE: info = boolF(fs); break;
      case VNIL: info = nilK(fs); break;
      case VKINT: info = luaK_intK(fs, e->u.ival); break;
      case VKFLT: info = luaK_numberK(fs, e->u.nval); break;
      case VKSTR: info = stringK(fs, e->u.strval); break;
      case VK: info = e->u.info; break;
      default: return 0;  /* not a constant */
    }
    if (info <= MAXINDEXRK) {  /* does constant fit in 'argC'? */
      e->k = VK;  /* make expression a 'K' expression */
      e->u.info = info;
      return 1;
    }
  }
  /* else, expression doesn't fit; leave it unchanged */
  return 0;
}